

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat4 * dja::transpose(mat4 *m)

{
  float_t fVar1;
  float_t fVar2;
  float_t fVar3;
  float_t fVar4;
  float_t fVar5;
  float_t fVar6;
  float_t fVar7;
  float_t fVar8;
  float_t fVar9;
  float_t fVar10;
  float_t fVar11;
  float_t fVar12;
  float_t fVar13;
  float_t fVar14;
  float_t fVar15;
  mat4 *in_RDI;
  
  fVar1 = m->m[1].x;
  fVar2 = m->m[2].x;
  fVar3 = m->m[3].x;
  fVar4 = m->m[0].y;
  fVar5 = m->m[1].y;
  fVar6 = m->m[2].y;
  fVar7 = m->m[3].y;
  fVar8 = m->m[0].z;
  fVar9 = m->m[1].z;
  fVar10 = m->m[2].z;
  fVar11 = m->m[3].z;
  fVar12 = m->m[0].w;
  fVar13 = m->m[1].w;
  fVar14 = m->m[2].w;
  fVar15 = m->m[3].w;
  in_RDI->m[0].x = m->m[0].x;
  in_RDI->m[0].y = fVar1;
  in_RDI->m[0].z = fVar2;
  in_RDI->m[0].w = fVar3;
  in_RDI->m[1].x = fVar4;
  in_RDI->m[1].y = fVar5;
  in_RDI->m[1].z = fVar6;
  in_RDI->m[1].w = fVar7;
  in_RDI->m[2].x = fVar8;
  in_RDI->m[2].y = fVar9;
  in_RDI->m[2].z = fVar10;
  in_RDI->m[2].w = fVar11;
  in_RDI->m[3].x = fVar12;
  in_RDI->m[3].y = fVar13;
  in_RDI->m[3].z = fVar14;
  in_RDI->m[3].w = fVar15;
  return in_RDI;
}

Assistant:

mat4 transpose(const mat4& m)
{
    return mat4(M00(m), M10(m), M20(m), M30(m),
                M01(m), M11(m), M21(m), M31(m),
                M02(m), M12(m), M22(m), M32(m),
                M03(m), M13(m), M23(m), M33(m));
}